

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

bool dxil_spv::emit_texture_load_instruction(Impl *impl,CallInst *instruction)

{
  initializer_list<unsigned_int> __l;
  Operation *pOVar1;
  CallInst *pCVar2;
  bool bVar3;
  bool bVar4;
  Id IVar5;
  ImageOperandsMask IVar6;
  Value *pVVar7;
  mapped_type *pmVar8;
  Type *pTVar9;
  Builder *this;
  Type *target_type;
  initializer_list<unsigned_int> local_f8;
  Operation *local_e8;
  Operation *add_op;
  uint i_1;
  Id coord_id;
  Operation *op;
  Op opcode;
  Id local_c4;
  Op *local_c0;
  undefined8 local_b8;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_b0;
  Id local_94;
  Id local_90;
  Id sample_type;
  Id texel_type;
  ComponentType effective_component_type;
  bool sparse;
  mapped_type *local_80;
  mapped_type *access_meta;
  Id offsets [4];
  uint local_5c;
  uint32_t local_58;
  uint i;
  uint num_coords;
  uint num_coords_full;
  Id coord [3];
  Id mip_or_sample;
  uint32_t image_ops;
  bool is_uav;
  mapped_type *meta;
  Id image_type_id;
  Id image_id;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  bVar3 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  if (bVar3) {
    _image_type_id = Converter::Impl::builder((Impl *)instruction_local);
    pCVar2 = instruction_local;
    pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
    meta._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar7,0);
    meta._0_4_ = Converter::Impl::get_type_id((Impl *)instruction_local,meta._4_4_);
    pmVar8 = std::
             unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
             ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>_>
                           *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                              _M_rehash_policy._M_next_resize,(key_type *)((long)&meta + 4));
    bVar3 = spv::Builder::isStorageImageType(_image_type_id,(Id)meta);
    coord[2] = 0;
    coord[1] = 0;
    pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
    bVar4 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar7);
    pCVar2 = instruction_local;
    if (!bVar4) {
      pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
      coord[1] = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar7,0);
      bVar4 = spv::Builder::isMultisampledImageType(_image_type_id,(Id)meta);
      if (bVar4) {
        coord[2] = coord[2] | 0x40;
      }
      else {
        coord[2] = coord[2] | 2;
      }
    }
    memset(&num_coords,0,0xc);
    i = 0;
    local_58 = 0;
    bVar4 = get_image_dimensions((Impl *)instruction_local,meta._4_4_,&i,&local_58);
    if (bVar4) {
      if (i < 4) {
        for (local_5c = 0; pCVar2 = instruction_local, local_5c < i; local_5c = local_5c + 1) {
          pVVar7 = LLVMBC::Instruction::getOperand((Instruction *)builder,local_5c + 3);
          IVar5 = Converter::Impl::get_id_for_value((Impl *)pCVar2,pVVar7,0);
          (&num_coords)[local_5c] = IVar5;
        }
        memset(&access_meta,0,0x10);
        bVar4 = get_texel_offsets((Impl *)instruction_local,(CallInst *)builder,coord + 2,6,local_58
                                  ,(Id *)&access_meta,false);
        if (bVar4) {
          _texel_type = builder;
          local_80 = std::
                     unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                     ::operator[]((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::CompositeMeta,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>_>
                                   *)&instruction_local[10].super_Instruction.attachments._M_h.
                                      _M_before_begin,(key_type *)&texel_type);
          sample_type._3_1_ = (local_80->access_mask & 0x10) != 0;
          if ((bool)sample_type._3_1_) {
            spv::Builder::addCapability(_image_type_id,CapabilitySparseResidency);
          }
          sample_type._2_1_ =
               Converter::Impl::get_effective_typed_resource_type(pmVar8->component_type);
          local_94 = Converter::Impl::get_type_id
                               ((Impl *)instruction_local,sample_type._2_1_,1,4,false);
          pCVar2 = instruction_local;
          local_90 = local_94;
          if ((sample_type._3_1_ & 1) != 0) {
            opcode = spv::Builder::makeUintType(_image_type_id,0x20);
            local_c4 = local_90;
            local_c0 = &opcode;
            local_b8 = 2;
            __l._M_len = 2;
            __l._M_array = local_c0;
            std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                      (&local_b0,__l,(allocator_type *)((long)&op + 7));
            local_94 = Converter::Impl::get_struct_type((Impl *)pCVar2,&local_b0,0,"SparseTexel");
            std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
                      (&local_b0);
          }
          if (bVar3) {
            op._0_4_ = OpImageRead;
            if ((sample_type._3_1_ & 1) != 0) {
              op._0_4_ = OpImageSparseRead;
            }
          }
          else {
            op._0_4_ = OpImageFetch;
            if ((sample_type._3_1_ & 1) != 0) {
              op._0_4_ = OpImageSparseFetch;
            }
          }
          _i_1 = Converter::Impl::allocate
                           ((Impl *)instruction_local,(Op)op,(Value *)builder,local_94);
          pCVar2 = instruction_local;
          if ((sample_type._3_1_ & 1) == 0) {
            pTVar9 = LLVMBC::Value::getType((Value *)builder);
            pTVar9 = LLVMBC::Type::getStructElementType(pTVar9,0);
            Converter::Impl::decorate_relaxed_precision((Impl *)pCVar2,pTVar9,_i_1->id,true);
          }
          pCVar2 = instruction_local;
          IVar5 = spv::Builder::makeUintType(_image_type_id,0x20);
          add_op._4_4_ = Converter::Impl::build_vector((Impl *)pCVar2,IVar5,&num_coords,i);
          if ((!bVar3) && ((coord[2] & 0x10) != 0)) {
            for (add_op._0_4_ = local_58; pCVar2 = instruction_local, (uint)add_op < i;
                add_op._0_4_ = (uint)add_op + 1) {
              IVar5 = spv::Builder::makeIntConstant(_image_type_id,0,false);
              offsets[(ulong)(uint)add_op - 2] = IVar5;
            }
            IVar5 = spv::Builder::makeIntType(_image_type_id,0x20);
            IVar5 = Converter::Impl::build_vector_type((Impl *)pCVar2,IVar5,i);
            local_e8 = Converter::Impl::allocate((Impl *)pCVar2,OpIAdd,IVar5);
            Operation::add_id(local_e8,add_op._4_4_);
            pOVar1 = local_e8;
            IVar5 = build_texel_offset_vector
                              ((Impl *)instruction_local,(Id *)&access_meta,i,coord[2],false);
            Operation::add_id(pOVar1,IVar5);
            Converter::Impl::add((Impl *)instruction_local,local_e8,false);
            add_op._4_4_ = local_e8->id;
            IVar6 = spv::operator~(ImageOperandsOffsetMask);
            coord[2] = IVar6 & coord[2];
          }
          target_type._0_4_ = meta._4_4_;
          target_type._4_4_ = add_op._4_4_;
          local_f8._M_array = (iterator)&target_type;
          local_f8._M_len = 2;
          Operation::add_ids(_i_1,&local_f8);
          Operation::add_literal(_i_1,coord[2]);
          if (!bVar3) {
            if ((coord[2] & 2) != 0) {
              Operation::add_id(_i_1,coord[1]);
            }
            pOVar1 = _i_1;
            if ((coord[2] & 8) != 0) {
              IVar5 = build_texel_offset_vector
                                ((Impl *)instruction_local,(Id *)&access_meta,local_58,coord[2],
                                 false);
              Operation::add_id(pOVar1,IVar5);
            }
          }
          if (((coord[2] & 0x40) != 0) && (Operation::add_id(_i_1,coord[1]), bVar3)) {
            this = Converter::Impl::builder((Impl *)instruction_local);
            spv::Builder::addCapability(this,CapabilityStorageImageMultisample);
          }
          Converter::Impl::add((Impl *)instruction_local,_i_1,(bool)(pmVar8->rov & 1));
          pTVar9 = LLVMBC::Value::getType((Value *)builder);
          pTVar9 = LLVMBC::Type::getStructElementType(pTVar9,0);
          if ((sample_type._3_1_ & 1) == 0) {
            Converter::Impl::fixup_load_type_typed
                      ((Impl *)instruction_local,pmVar8->component_type,4,(Value *)builder,pTVar9);
            build_exploded_composite_from_vector((Impl *)instruction_local,(Instruction *)builder,4)
            ;
          }
          else {
            Converter::Impl::repack_sparse_feedback
                      ((Impl *)instruction_local,pmVar8->component_type,4,(Value *)builder,pTVar9,0)
            ;
          }
          impl_local._7_1_ = true;
        }
        else {
          impl_local._7_1_ = false;
        }
      }
      else {
        impl_local._7_1_ = false;
      }
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  else {
    impl_local._7_1_ = true;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_texture_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// Elide dead loads.
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_type_id = impl.get_type_id(image_id);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	bool is_uav = builder.isStorageImageType(image_type_id);
	uint32_t image_ops = 0;

	spv::Id mip_or_sample = 0;
	if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(2)))
	{
		mip_or_sample = impl.get_id_for_value(instruction->getOperand(2));
		if (builder.isMultisampledImageType(image_type_id))
			image_ops |= spv::ImageOperandsSampleMask;
		else
			image_ops |= spv::ImageOperandsLodMask;
	}

	spv::Id coord[3] = {};

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	// Cubes are not supported here.
	if (num_coords_full > 3)
		return false;

	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 3));

	spv::Id offsets[4] = {};
	if (!get_texel_offsets(impl, instruction, image_ops, 6, num_coords, offsets, false))
		return false;

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, 4);
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	spv::Op opcode;
	if (is_uav)
		opcode = sparse ? spv::OpImageSparseRead : spv::OpImageRead;
	else
		opcode = sparse ? spv::OpImageSparseFetch : spv::OpImageFetch;

	Operation *op = impl.allocate(opcode, instruction, sample_type);
	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	spv::Id coord_id = impl.build_vector(builder.makeUintType(32), coord, num_coords_full);
	if (!is_uav && (image_ops & spv::ImageOperandsOffsetMask))
	{
		// Don't need fancy features for fetch, just do arith.
		for (unsigned i = num_coords; i < num_coords_full; i++)
			offsets[i] = builder.makeIntConstant(0);
		auto *add_op = impl.allocate(spv::OpIAdd, impl.build_vector_type(builder.makeIntType(32), num_coords_full));
		add_op->add_id(coord_id);
		add_op->add_id(build_texel_offset_vector(impl, offsets, num_coords_full, image_ops, false));
		impl.add(add_op);
		coord_id = add_op->id;
		image_ops &= ~spv::ImageOperandsOffsetMask;
	}

	op->add_ids({ image_id, coord_id });
	op->add_literal(image_ops);

	if (!is_uav)
	{
		if (image_ops & spv::ImageOperandsLodMask)
			op->add_id(mip_or_sample);

		if (image_ops & spv::ImageOperandsConstOffsetMask)
			op->add_id(build_texel_offset_vector(impl, offsets, num_coords, image_ops, false));
	}

	if (image_ops & spv::ImageOperandsSampleMask)
	{
		op->add_id(mip_or_sample);
		if (is_uav)
			impl.builder().addCapability(spv::CapabilityStorageImageMultisample);
	}

	impl.add(op, meta.rov);

	auto *target_type = instruction->getType()->getStructElementType(0);

	if (sparse)
		impl.repack_sparse_feedback(meta.component_type, 4, instruction, target_type);
	else
	{
		impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
		build_exploded_composite_from_vector(impl, instruction, 4);
	}
	return true;
}